

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::push_back
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this)

{
  StatusInfo local_14;
  PropertyT<OpenMesh::Attributes::StatusInfo> *local_10;
  PropertyT<OpenMesh::Attributes::StatusInfo> *this_local;
  
  local_10 = this;
  Attributes::StatusInfo::StatusInfo(&local_14);
  std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>::
  push_back(&this->data_,&local_14);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }